

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.h
# Opt level: O2

Field __thiscall
winmd::reader::EnumDefinition::get_enumerator(EnumDefinition *this,string_view *name)

{
  row_base<winmd::reader::Field> rVar1;
  pair<winmd::reader::Field,_winmd::reader::Field> fields;
  pair<winmd::reader::Field,_winmd::reader::Field> local_30;
  
  TypeDef::FieldList(&local_30,&this->m_typedef);
  rVar1 = (row_base<winmd::reader::Field>)
          std::
          __find_if<winmd::reader::Field,__gnu_cxx::__ops::_Iter_pred<winmd::reader::EnumDefinition::get_enumerator(std::basic_string_view<char,std::char_traits<char>>const&)const::_lambda(auto:1&&)_1_>>
                    (local_30.first.super_row_base<winmd::reader::Field>.m_table,
                     local_30.first.super_row_base<winmd::reader::Field>.m_index,
                     local_30.second.super_row_base<winmd::reader::Field>.m_table,
                     local_30.second.super_row_base<winmd::reader::Field>.m_index,name);
  return (Field)rVar1;
}

Assistant:

auto get_enumerator(std::string_view const& name) const
        {
            auto fields = m_typedef.FieldList();

            auto field = std::find_if(begin(fields), end(fields), [&](auto&& field)
            {
                return field.Name() == name;
            });

            XLANG_ASSERT(field != end(fields));
            return field;
        }